

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

reference __thiscall
ft::deque<int,_ft::allocator<int>_>::back(deque<int,_ft::allocator<int>_> *this)

{
  reference pvVar1;
  undefined1 local_38 [8];
  iterator tmp;
  deque<int,_ft::allocator<int>_> *this_local;
  
  tmp.m_node = (map_pointer)this;
  dequeIterator<int,_64UL>::dequeIterator((dequeIterator<int,_64UL> *)local_38,&this->m_finish);
  dequeIterator<int,_64UL>::operator--((dequeIterator<int,_64UL> *)local_38);
  pvVar1 = dequeIterator<int,_64UL>::operator*((dequeIterator<int,_64UL> *)local_38);
  dequeIterator<int,_64UL>::~dequeIterator((dequeIterator<int,_64UL> *)local_38);
  return pvVar1;
}

Assistant:

reference 		back() {
		iterator	tmp = this->m_finish;
		--tmp;
		return *tmp;
	}